

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O2

uint64_t highwayhash::(anonymous_namespace)::RunHighwayCat<4u>(void *param_1,size_t size)

{
  ulong num_bytes;
  HHResult64 result;
  HighwayHashCatT<4U> cat;
  char in [1024];
  uint64_t local_548;
  HighwayHashCatT<4U> local_540;
  char local_470 [1104];
  
  local_540.state_.v0.v_[0] = -0x24192a2a01b331d1;
  local_540.state_.v0.v_[1] = -0x5bf6c7ddd660ce2f;
  local_540.state_.v0.v_[2] = 0x13198a2e03707346;
  local_540.state_.v0.v_[3] = 0x243f6a8885a308d0;
  local_540.state_.v1.v_[0] = 0x3bd39e10cb0ef593;
  local_540.state_.v1.v_[1] = -0x3f530e974a0e7574;
  local_540.state_.v1.v_[2] = -0x41ab9932cb16f394;
  local_540.state_.v1.v_[3] = 0x452821e538d01377;
  local_540.state_.mul0.v_[0] = -0x24192a2a01b331d1;
  local_540.state_.mul0.v_[1] = -0x5bf6c7ddd660ce30;
  local_540.state_.mul0.v_[2] = 0x13198a2e03707344;
  local_540.state_.mul0.v_[3] = 0x243f6a8885a308d3;
  local_540.state_.mul1.v_[0] = 0x3bd39e10cb0ef593;
  local_540.state_.mul1.v_[1] = -0x3f530e964a0e7574;
  local_540.state_.mul1.v_[2] = -0x41ab9930cb16f394;
  local_540.state_.mul1.v_[3] = 0x452821e638d01377;
  local_540.buffer_usage_ = 0;
  local_540.buffer_[0] = '\0';
  local_540.buffer_[1] = '\0';
  local_540.buffer_[2] = '\0';
  local_540.buffer_[3] = '\0';
  local_540.buffer_[4] = '\0';
  local_540.buffer_[5] = '\0';
  local_540.buffer_[6] = '\0';
  local_540.buffer_[7] = '\0';
  local_540.buffer_[8] = '\0';
  local_540.buffer_[9] = '\0';
  local_540.buffer_[10] = '\0';
  local_540.buffer_[0xb] = '\0';
  local_540.buffer_[0xc] = '\0';
  local_540.buffer_[0xd] = '\0';
  local_540.buffer_[0xe] = '\0';
  local_540.buffer_[0xf] = '\0';
  local_540.buffer_[0x10] = '\0';
  local_540.buffer_[0x11] = '\0';
  local_540.buffer_[0x12] = '\0';
  local_540.buffer_[0x13] = '\0';
  local_540.buffer_[0x14] = '\0';
  local_540.buffer_[0x15] = '\0';
  local_540.buffer_[0x16] = '\0';
  local_540.buffer_[0x17] = '\0';
  local_540.buffer_[0x18] = '\0';
  local_540.buffer_[0x19] = '\0';
  local_540.buffer_[0x1a] = '\0';
  local_540.buffer_[0x1b] = '\0';
  local_540.buffer_[0x1c] = '\0';
  local_540.buffer_[0x1d] = '\0';
  local_540.buffer_[0x1e] = '\0';
  local_540.buffer_[0x1f] = '\0';
  local_470[0] = (char)size;
  num_bytes = size >> 1;
  HighwayHashCatT<4U>::Append(&local_540,local_470,num_bytes);
  HighwayHashCatT<4U>::Append(&local_540,local_470 + num_bytes,size - num_bytes);
  HighwayHashCatT<4U>::Finalize<unsigned_long>(&local_540,&local_548);
  return local_548;
}

Assistant:

uint64_t RunHighwayCat(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  HH_ALIGNAS(64) HighwayHashCatT<Target> cat(key);
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  const size_t half_size = size / 2;
  cat.Append(in, half_size);
  cat.Append(in + half_size, size - half_size);
  HHResult64 result;
  cat.Finalize(&result);
  return result;
}